

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Fts5Init(sqlite3 *db)

{
  long lVar1;
  int iVar2;
  undefined8 *pAux;
  long lVar3;
  BuiltinTokenizer *pBVar4;
  undefined **ppuVar5;
  void *p;
  ulong uVar6;
  fts5_tokenizer *pfVar7;
  long in_FS_OFFSET;
  byte bVar8;
  BuiltinTokenizer aBuiltin [3];
  
  bVar8 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pAux = (undefined8 *)sqlite3_malloc(0x70);
  if (pAux == (undefined8 *)0x0) {
    iVar2 = 7;
  }
  else {
    pAux[6] = 0;
    pAux[7] = 0;
    *pAux = 0;
    pAux[1] = 0;
    pAux[2] = 0;
    pAux[3] = 0;
    pAux[4] = 0;
    pAux[5] = 0;
    pAux[0xc] = 0;
    pAux[0xd] = 0;
    pAux[10] = 0;
    pAux[0xb] = 0;
    pAux[8] = 0;
    pAux[9] = 0;
    pAux[6] = db;
    *(undefined4 *)pAux = 3;
    pAux[3] = fts5CreateAux;
    pAux[1] = fts5CreateTokenizer;
    pAux[2] = fts5FindTokenizer;
    pAux[4] = fts5CreateTokenizer_v2;
    pAux[5] = fts5FindTokenizer_v2;
    sqlite3_randomness(0x10,pAux + 0xc);
    *(uint *)(pAux + 0xc) = *(uint *)(pAux + 0xc) ^ 0xf924976d;
    *(uint *)((long)pAux + 100) = *(uint *)((long)pAux + 100) ^ 0x16596e13;
    *(uint *)(pAux + 0xd) = *(uint *)(pAux + 0xd) ^ 0x7c80beaa;
    *(uint *)((long)pAux + 0x6c) = *(uint *)((long)pAux + 0x6c) ^ 0x9b03a67f;
    iVar2 = createModule(db,"fts5",(sqlite3_module *)fts5Init_fts5Mod,pAux,fts5ModuleDestroy);
    if (iVar2 == 0) {
      ppuVar5 = &PTR_fts5SnippetFunction_0022a2e0;
      iVar2 = 0;
      for (uVar6 = 0; (iVar2 == 0 && (uVar6 < 4)); uVar6 = uVar6 + 1) {
        iVar2 = (*(code *)pAux[3])(pAux,ppuVar5[-2],0,*ppuVar5);
        ppuVar5 = ppuVar5 + 4;
      }
      if (iVar2 == 0) {
        ppuVar5 = &PTR_anon_var_dwarf_7bbbc_0022a350;
        pBVar4 = aBuiltin;
        for (lVar3 = 0xc; lVar3 != 0; lVar3 = lVar3 + -1) {
          pBVar4->zName = *ppuVar5;
          ppuVar5 = ppuVar5 + (ulong)bVar8 * -2 + 1;
          pBVar4 = (BuiltinTokenizer *)((long)pBVar4 + (ulong)bVar8 * -0x10 + 8);
        }
        pBVar4 = aBuiltin;
        iVar2 = 0;
        for (uVar6 = 0; (pfVar7 = &pBVar4->x, iVar2 == 0 && (uVar6 < 3)); uVar6 = uVar6 + 1) {
          iVar2 = (*(code *)pAux[1])(pAux,*(undefined8 *)((long)(pfVar7 + -1) + 0x10),pAux,pfVar7);
          pBVar4 = (BuiltinTokenizer *)(pfVar7 + 1);
        }
        if (iVar2 == 0) {
          iVar2 = (*(code *)pAux[4])(pAux,"porter",pAux);
          if (iVar2 == 0) {
            iVar2 = createModule(db,"fts5vocab",(sqlite3_module *)sqlite3Fts5VocabInit_fts5Vocab,
                                 pAux,(_func_void_void_ptr *)0x0);
            if (iVar2 == 0) {
              iVar2 = sqlite3_create_function
                                (db,"fts5",1,1,pAux,fts5Fts5Func,
                                 (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                                 (_func_void_sqlite3_context_ptr *)0x0);
              if (iVar2 == 0) {
                iVar2 = sqlite3_create_function
                                  (db,"fts5_source_id",0,0x200801,pAux,fts5SourceIdFunc,
                                   (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                                   (_func_void_sqlite3_context_ptr *)0x0);
                if (iVar2 == 0) {
                  iVar2 = sqlite3_create_function
                                    (db,"fts5_locale",2,0x1300001,pAux,fts5LocaleFunc,
                                     (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0
                                     ,(_func_void_sqlite3_context_ptr *)0x0);
                  if (iVar2 == 0) {
                    iVar2 = sqlite3_create_function
                                      (db,"fts5_insttoken",1,0x1200001,pAux,fts5InsttokenFunc,
                                       (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)
                                       0x0,(_func_void_sqlite3_context_ptr *)0x0);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts5Init(sqlite3 *db){
  return fts5Init(db);
}